

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

tc_uECC_word_t
tc_uECC_vli_add(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
               wordcount_t num_words)

{
  uint uVar1;
  tc_uECC_word_t val;
  tc_uECC_word_t sum;
  wordcount_t i;
  tc_uECC_word_t carry;
  wordcount_t num_words_local;
  tc_uECC_word_t *right_local;
  tc_uECC_word_t *left_local;
  tc_uECC_word_t *result_local;
  
  sum = 0;
  for (val._3_1_ = '\0'; val._3_1_ < num_words; val._3_1_ = val._3_1_ + '\x01') {
    uVar1 = left[val._3_1_] + right[val._3_1_] + sum;
    sum = cond_set((uint)(uVar1 < left[val._3_1_]),sum,(uint)(uVar1 != left[val._3_1_]));
    result[val._3_1_] = uVar1;
  }
  return sum;
}

Assistant:

static tc_uECC_word_t tc_uECC_vli_add(tc_uECC_word_t *result, const tc_uECC_word_t *left,
				const tc_uECC_word_t *right, wordcount_t num_words)
{
	tc_uECC_word_t carry = 0;
	wordcount_t i;
	for (i = 0; i < num_words; ++i) {
		tc_uECC_word_t sum = left[i] + right[i] + carry;
		tc_uECC_word_t val = (sum < left[i]);
		carry = cond_set(val, carry, (sum != left[i]));
		result[i] = sum;
	}
	return carry;
}